

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

char * openjtalk_getDicSjis(OpenJTalk *oj,char *path)

{
  char *pcVar1;
  
  if (oj == (OpenJTalk *)0x0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else if (path == (char *)0x0) {
    oj->errorCode = OPENJTALKERROR_BUFFER_IS_NULL;
  }
  else {
    oj->errorCode = OPENJTALKERROR_NO_ERROR;
    if (oj->dn_dic_path[0] != '\0') {
      pcVar1 = convert_charset_path(oj->dn_dic_path,CS_UTF_8,path,CS_SHIFT_JIS);
      return pcVar1;
    }
    oj->errorCode = OPENJTALKERROR_PATH_STRING_IS_NULL_OR_EMPTY;
  }
  return (char *)0x0;
}

Assistant:

OPENJTALK_DLL_API char *OPENJTALK_CONVENTION openjtalk_getDicSjis(OpenJTalk *oj, char *path)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return NULL;
	}

	if (!path)
	{
		oj->errorCode = OPENJTALKERROR_BUFFER_IS_NULL;
		return NULL;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	if (!oj->dn_dic_path || strlen(oj->dn_dic_path) == 0)
	{
		oj->errorCode = OPENJTALKERROR_PATH_STRING_IS_NULL_OR_EMPTY;
		return NULL;
	}
#if defined(_WIN32)
	char *res = u8tosjis_path(oj->dn_dic_path, path);
#else
	char *res = u8tosjis_path(oj->dn_dic_path, path);
#endif
	return res;
}